

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     Finalize<duckdb::ModeState<signed_char,duckdb::ModeStandard<signed_char>>,signed_char,duckdb::ModeFunction<duckdb::ModeStandard<signed_char>>>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  AggregateFinalizeData finalize_data;
  AggregateFinalizeData local_48;
  
  local_48.result = result;
  local_48.input = aggr_input_data;
  if (states->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    local_48.result_idx = 0;
    ModeFunction<duckdb::ModeStandard<signed_char>>::
    Finalize<signed_char,duckdb::ModeState<signed_char,duckdb::ModeStandard<signed_char>>>
              (*(ModeState<signed_char,_duckdb::ModeStandard<signed_char>_> **)states->data,
               (char *)result->data,&local_48);
  }
  else {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar1 = states->data;
    pdVar2 = result->data;
    if (count != 0) {
      iVar3 = 0;
      do {
        local_48.result_idx = offset + iVar3;
        ModeFunction<duckdb::ModeStandard<signed_char>>::
        Finalize<signed_char,duckdb::ModeState<signed_char,duckdb::ModeStandard<signed_char>>>
                  (*(ModeState<signed_char,_duckdb::ModeStandard<signed_char>_> **)
                    (pdVar1 + iVar3 * 8),(char *)(pdVar2 + iVar3 + offset),&local_48);
        iVar3 = iVar3 + 1;
      } while (count != iVar3);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}